

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::Type,std::allocator<wasm::Type>>>
          (Random *this,vector<wasm::Type,_std::allocator<wasm::Type>_> *vec)

{
  pointer pTVar1;
  pointer pTVar2;
  uint32_t uVar3;
  
  pTVar1 = (vec->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (vec->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 != pTVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)pTVar2 - (long)pTVar1) >> 3));
    return (vec->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::Type>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }